

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_cert.cc
# Opt level: O3

bool bssl::ssl_cert_check_key_usage(CBS *in,ssl_key_usage_t bit)

{
  bool bVar1;
  int iVar2;
  int line;
  int has_extensions;
  CBS tbs_cert;
  CBS extensions;
  CBS bit_string;
  CBS contents;
  CBS oid;
  CBS extension;
  CBS outer_extensions;
  CBS buf;
  int local_bc;
  CBS local_b8;
  CBS local_a8;
  CBS local_98;
  CBS local_88;
  CBS local_78;
  CBS local_68;
  CBS local_58;
  CBS local_48;
  
  local_48.data = in->data;
  local_48.len = in->len;
  bVar1 = ssl_cert_skip_to_spki(&local_48,&local_b8);
  if ((((bVar1) && (iVar2 = CBS_get_asn1(&local_b8,(CBS *)0x0,0x20000010), iVar2 != 0)) &&
      (iVar2 = CBS_get_optional_asn1(&local_b8,(CBS *)0x0,(int *)0x0,0x80000001), iVar2 != 0)) &&
     ((iVar2 = CBS_get_optional_asn1(&local_b8,(CBS *)0x0,(int *)0x0,0x80000002), iVar2 != 0 &&
      (iVar2 = CBS_get_optional_asn1(&local_b8,&local_58,&local_bc,0xa0000003), iVar2 != 0)))) {
    if (local_bc == 0) {
      return true;
    }
    iVar2 = CBS_get_asn1(&local_58,&local_a8,0x20000010);
    if (iVar2 == 0) {
      iVar2 = 0x110;
      line = 0x145;
    }
    else {
      if (local_a8.len == 0) {
        return true;
      }
      while( true ) {
        iVar2 = CBS_get_asn1(&local_a8,&local_68,0x20000010);
        if ((((iVar2 == 0) || (iVar2 = CBS_get_asn1(&local_68,&local_78,6), iVar2 == 0)) ||
            ((iVar2 = CBS_peek_asn1_tag(&local_68,1), iVar2 != 0 &&
             (iVar2 = CBS_get_asn1(&local_68,(CBS *)0x0,1), iVar2 == 0)))) ||
           ((iVar2 = CBS_get_asn1(&local_68,&local_88,4), iVar2 == 0 || (local_68.len != 0)))) {
          iVar2 = 0x110;
          line = 0x151;
          goto LAB_0014db2e;
        }
        if ((local_78.len == 3) &&
           ((char)*(short *)((long)local_78.data + 2) == '\x0f' && *(short *)local_78.data == 0x1d55
           )) break;
        if (local_a8.len == 0) {
          return true;
        }
      }
      iVar2 = CBS_get_asn1(&local_88,&local_98,3);
      if ((iVar2 == 0) || (local_88.len != 0)) {
        iVar2 = 0x110;
        line = 0x15f;
      }
      else {
        iVar2 = CBS_is_valid_asn1_bitstring(&local_98);
        if (iVar2 == 0) {
          iVar2 = 0x110;
          line = 0x166;
        }
        else {
          iVar2 = CBS_asn1_bitstring_has_bit(&local_98,bit);
          if (iVar2 != 0) {
            return true;
          }
          iVar2 = 0x12e;
          line = 0x16b;
        }
      }
    }
  }
  else {
    iVar2 = 0x110;
    line = 0x13b;
  }
LAB_0014db2e:
  ERR_put_error(0x10,0,iVar2,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_cert.cc"
                ,line);
  return false;
}

Assistant:

bool ssl_cert_check_key_usage(const CBS *in, enum ssl_key_usage_t bit) {
  CBS buf = *in;

  CBS tbs_cert, outer_extensions;
  int has_extensions;
  if (!ssl_cert_skip_to_spki(&buf, &tbs_cert) ||
      // subjectPublicKeyInfo
      !CBS_get_asn1(&tbs_cert, NULL, CBS_ASN1_SEQUENCE) ||
      // issuerUniqueID
      !CBS_get_optional_asn1(&tbs_cert, NULL, NULL,
                             CBS_ASN1_CONTEXT_SPECIFIC | 1) ||
      // subjectUniqueID
      !CBS_get_optional_asn1(&tbs_cert, NULL, NULL,
                             CBS_ASN1_CONTEXT_SPECIFIC | 2) ||
      !CBS_get_optional_asn1(
          &tbs_cert, &outer_extensions, &has_extensions,
          CBS_ASN1_CONSTRUCTED | CBS_ASN1_CONTEXT_SPECIFIC | 3)) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_CANNOT_PARSE_LEAF_CERT);
    return false;
  }

  if (!has_extensions) {
    return true;
  }

  CBS extensions;
  if (!CBS_get_asn1(&outer_extensions, &extensions, CBS_ASN1_SEQUENCE)) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_CANNOT_PARSE_LEAF_CERT);
    return false;
  }

  while (CBS_len(&extensions) > 0) {
    CBS extension, oid, contents;
    if (!CBS_get_asn1(&extensions, &extension, CBS_ASN1_SEQUENCE) ||
        !CBS_get_asn1(&extension, &oid, CBS_ASN1_OBJECT) ||
        (CBS_peek_asn1_tag(&extension, CBS_ASN1_BOOLEAN) &&
         !CBS_get_asn1(&extension, NULL, CBS_ASN1_BOOLEAN)) ||
        !CBS_get_asn1(&extension, &contents, CBS_ASN1_OCTETSTRING) ||
        CBS_len(&extension) != 0) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_CANNOT_PARSE_LEAF_CERT);
      return false;
    }

    static const uint8_t kKeyUsageOID[3] = {0x55, 0x1d, 0x0f};
    if (CBS_len(&oid) != sizeof(kKeyUsageOID) ||
        OPENSSL_memcmp(CBS_data(&oid), kKeyUsageOID, sizeof(kKeyUsageOID)) !=
            0) {
      continue;
    }

    CBS bit_string;
    if (!CBS_get_asn1(&contents, &bit_string, CBS_ASN1_BITSTRING) ||
        CBS_len(&contents) != 0) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_CANNOT_PARSE_LEAF_CERT);
      return false;
    }

    // This is the KeyUsage extension. See
    // https://tools.ietf.org/html/rfc5280#section-4.2.1.3
    if (!CBS_is_valid_asn1_bitstring(&bit_string)) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_CANNOT_PARSE_LEAF_CERT);
      return false;
    }

    if (!CBS_asn1_bitstring_has_bit(&bit_string, bit)) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_KEY_USAGE_BIT_INCORRECT);
      return false;
    }

    return true;
  }

  // No KeyUsage extension found.
  return true;
}